

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::readEditMetaData(PtexReader *this)

{
  pointer pMVar1;
  bool bVar2;
  EditMetaDataHeader emdh;
  MetaEdit local_18;
  
  bVar2 = readBlock(this,&emdh,8,true);
  if (bVar2) {
    local_18.pos = 0;
    local_18.zipsize = 0;
    local_18.memsize = 0;
    std::vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
    ::emplace_back<Ptex::v2_2::PtexReader::MetaEdit>(&this->_metaedits,&local_18);
    pMVar1 = (this->_metaedits).
             super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar1[-1].pos = this->_pos;
    pMVar1[-1].zipsize = emdh.metadatazipsize;
    pMVar1[-1].memsize = emdh.metadatamemsize;
  }
  return;
}

Assistant:

void PtexReader::readEditMetaData()
{
    // read header
    EditMetaDataHeader emdh;
    if (!readBlock(&emdh, EditMetaDataHeaderSize)) return;

    // record header info for later
    _metaedits.push_back(MetaEdit());
    MetaEdit& e = _metaedits.back();
    e.pos = tell();
    e.zipsize = emdh.metadatazipsize;
    e.memsize = emdh.metadatamemsize;
}